

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_map.h
# Opt level: O1

void __thiscall
tsl::
robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::reserve(robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
          *this,size_type count_)

{
  ulong count__00;
  ulong uVar1;
  float fVar2;
  float fVar3;
  
  fVar3 = (this->m_ht).m_max_load_factor;
  fVar2 = ceilf((float)count_ / fVar3);
  uVar1 = (long)(fVar2 - 9.223372e+18) & (long)fVar2 >> 0x3f | (long)fVar2;
  fVar3 = ceilf((float)(this->m_ht).m_nb_elements / fVar3);
  count__00 = (long)(fVar3 - 9.223372e+18) & (long)fVar3 >> 0x3f | (long)fVar3;
  if (count__00 <= uVar1) {
    count__00 = uVar1;
  }
  detail_robin_hash::
  robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  ::rehash_impl(&this->m_ht,count__00);
  return;
}

Assistant:

void reserve(size_type count_) { m_ht.reserve(count_); }